

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall helics::Federate::waitCommand_abi_cxx11_(Federate *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if ((*(byte *)(in_RSI + 0xf) & 1) != 0) {
    std::
    unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
    ::operator->((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                  *)0x266439);
    bVar1 = PotentialInterfacesManager::hasExtraCommands((PotentialInterfacesManager *)0x266441);
    if (bVar1) {
      std::
      unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ::operator->((unique_ptr<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                    *)0x266455);
      PotentialInterfacesManager::getCommand_abi_cxx11_
                ((PotentialInterfacesManager *)
                 CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      return in_RDI;
    }
  }
  peVar2 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x266474);
  (*peVar2->_vptr_Core[0x5d])(in_RDI,peVar2,(ulong)*(uint *)(in_RSI + 0x10));
  return in_RDI;
}

Assistant:

std::pair<std::string, std::string> Federate::waitCommand()
{
    if (hasPotentialInterfaces) {
        if (potManager->hasExtraCommands()) {
            return potManager->getCommand();
        }
    }
    return coreObject->waitCommand(fedID);
}